

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int bsd_accept_socket(int fd,bsd_addr_t *addr)

{
  int iVar1;
  bsd_addr_t *in_RSI;
  int in_EDI;
  int accepted_fd;
  
  in_RSI->len = 0x80;
  iVar1 = accept4(in_EDI,(sockaddr *)in_RSI,&in_RSI->len,0x80800);
  internal_finalize_bsd_addr(in_RSI);
  apple_no_sigpipe(iVar1);
  iVar1 = bsd_set_nonblocking(0);
  return iVar1;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_accept_socket(LIBUS_SOCKET_DESCRIPTOR fd, struct bsd_addr_t *addr) {
    LIBUS_SOCKET_DESCRIPTOR accepted_fd;
    addr->len = sizeof(addr->mem);

#if defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
    // Linux, FreeBSD
    accepted_fd = accept4(fd, (struct sockaddr *) addr, &addr->len, SOCK_CLOEXEC | SOCK_NONBLOCK);
#else
    // Windows, OS X
    accepted_fd = accept(fd, (struct sockaddr *) addr, &addr->len);

#endif

    internal_finalize_bsd_addr(addr);

    return bsd_set_nonblocking(apple_no_sigpipe(accepted_fd));
}